

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.hpp
# Opt level: O2

void __thiscall goodform::error_message::error_message(error_message *this,string *message)

{
  (this->message_)._M_dataplus._M_p = (pointer)&(this->message_).field_2;
  (this->message_)._M_string_length = 0;
  (this->message_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

error_message(const std::string& message) { this->message_ = message; }